

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void do_vicinity_map(void)

{
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int hi_x;
  int lo_x;
  int hi_y;
  int lo_y;
  int zy;
  int zx;
  
  if (u.uy + -5 < 0) {
    local_24 = 0;
  }
  else {
    local_24 = u.uy + -5;
  }
  if (u.uy + 6 < 0x16) {
    local_28 = u.uy + 6;
  }
  else {
    local_28 = 0x15;
  }
  if (u.ux + -9 < 1) {
    local_2c = 1;
  }
  else {
    local_2c = u.ux + -9;
  }
  if (u.ux + 10 < 0x51) {
    local_30 = u.ux + 10;
  }
  else {
    local_30 = 0x50;
  }
  for (lo_y = local_2c; lo_y < local_30; lo_y = lo_y + 1) {
    for (hi_y = local_24; hi_y < local_28; hi_y = hi_y + 1) {
      show_map_spot(lo_y,hi_y);
    }
  }
  if (((*(uint *)&(level->flags).field_0x8 >> 0xe & 1) == 0) || (((byte)u._1052_1_ >> 1 & 1) != 0))
  {
    flush_screen();
    (*windowprocs.win_pause)(P_MAP);
    doredraw();
  }
  return;
}

Assistant:

void do_vicinity_map(void)
{
    int zx, zy;
    int lo_y = (u.uy-5 < 0 ? 0 : u.uy-5),
	hi_y = (u.uy+6 > ROWNO ? ROWNO : u.uy+6),
	lo_x = (u.ux-9 < 1 ? 1 : u.ux-9),	/* avoid column 0 */
	hi_x = (u.ux+10 > COLNO ? COLNO : u.ux+10);

    for (zx = lo_x; zx < hi_x; zx++)
	for (zy = lo_y; zy < hi_y; zy++)
	    show_map_spot(zx, zy);

    if (!level->flags.hero_memory || Underwater) {
	flush_screen();			/* flush temp screen */
	win_pause_output(P_MAP);	/* wait */
	doredraw();
    }
}